

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElDisc.cpp
# Opt level: O3

void __thiscall TPZCompElDisc::Print(TPZCompElDisc *this,ostream *out)

{
  double *pdVar1;
  int iVar2;
  TPZGeoEl *pTVar3;
  ostream *poVar4;
  long *plVar5;
  ulong uVar6;
  ulong uVar7;
  TPZManVector<double,_3> xcenter;
  TPZManVector<double,_3> local_98;
  TPZManVector<double,_3> local_60;
  
  std::__ostream_insert<char,std::char_traits<char>>(out,"\nDiscontinous element : \n",0x19);
  TPZCompEl::Print((TPZCompEl *)this,out);
  pTVar3 = TPZCompEl::Reference((TPZCompEl *)this);
  if (pTVar3 != (TPZGeoEl *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>(out,"\tGeometric reference index : ",0x1d);
    TPZCompEl::Reference((TPZCompEl *)this);
    poVar4 = std::ostream::_M_insert<long>((long)out);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,"\tMaterial id : ",0xf);
  pTVar3 = TPZCompEl::Reference((TPZCompEl *)this);
  plVar5 = (long *)std::ostream::operator<<(out,pTVar3->fMatId);
  std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
  std::ostream::put((char)plVar5);
  poVar4 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\tDegree of interpolation : ",0x1b);
  iVar2 = (**(code **)(*(long *)&(this->super_TPZInterpolationSpace).super_TPZCompEl + 0x338))(this)
  ;
  plVar5 = (long *)std::ostream::operator<<(poVar4,iVar2);
  std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
  std::ostream::put((char)plVar5);
  poVar4 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\tConnect index : ",0x11);
  poVar4 = std::ostream::_M_insert<long>((long)poVar4);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  poVar4 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\tUsing qsieta : ",0x10);
  plVar5 = (long *)std::ostream::operator<<(poVar4,(uint)this->fUseQsiEta);
  std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
  std::ostream::put((char)plVar5);
  poVar4 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\tNormalizing constant : ",0x18);
  poVar4 = std::ostream::_M_insert<double>(this->fConstC);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  poVar4 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\tCenter point of the element : ",0x1f)
  ;
  if (this->fUseQsiEta == false) {
    iVar2 = (int)(this->fCenterPoint).super_TPZVec<double>.fNElements;
    if (iVar2 < 2) {
      uVar7 = 0;
    }
    else {
      uVar7 = (ulong)(iVar2 - 1);
      uVar6 = 0;
      do {
        poVar4 = std::ostream::_M_insert<double>
                           ((this->fCenterPoint).super_TPZVec<double>.fStore[uVar6]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," , ",3);
        uVar6 = uVar6 + 1;
      } while (uVar7 != uVar6);
    }
    std::__ostream_insert<char,std::char_traits<char>>(out,"stored xy : ",0xc);
    poVar4 = std::ostream::_M_insert<double>
                       ((this->fCenterPoint).super_TPZVec<double>.fStore[uVar7]);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    goto LAB_011fa240;
  }
  pTVar3 = TPZCompEl::Reference((TPZCompEl *)this);
  if (pTVar3 == (TPZGeoEl *)0x0) goto LAB_011fa240;
  TPZManVector<double,_3>::TPZManVector(&local_60,3);
  local_98.super_TPZVec<double>.fStore = (double *)0x0;
  local_98.super_TPZVec<double>.fNElements = 0;
  local_98.super_TPZVec<double>.fNAlloc = 0;
  local_98.super_TPZVec<double>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01819f98;
  uVar7 = (this->fCenterPoint).super_TPZVec<double>.fNElements;
  if ((long)uVar7 < 4) {
    local_98.super_TPZVec<double>.fStore = local_98.fExtAlloc;
    if (0 < (long)uVar7) goto LAB_011fa13f;
  }
  else {
    local_98.super_TPZVec<double>.fStore =
         (double *)operator_new__(-(ulong)(uVar7 >> 0x3d != 0) | uVar7 * 8);
    local_98.super_TPZVec<double>.fNAlloc = uVar7;
LAB_011fa13f:
    pdVar1 = (this->fCenterPoint).super_TPZVec<double>.fStore;
    uVar6 = 0;
    do {
      local_98.super_TPZVec<double>.fStore[uVar6] = pdVar1[uVar6];
      uVar6 = uVar6 + 1;
    } while (uVar7 != uVar6);
  }
  local_98.super_TPZVec<double>.fNElements = uVar7;
  (**(code **)(*(long *)pTVar3 + 0x228))(pTVar3,&local_98,&local_60);
  std::__ostream_insert<char,std::char_traits<char>>(out,"stored qsieta ",0xe);
  poVar4 = ::operator<<(out,&(this->fCenterPoint).super_TPZVec<double>);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," computed xy ",0xd);
  poVar4 = ::operator<<(poVar4,&local_60.super_TPZVec<double>);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  TPZManVector<double,_3>::~TPZManVector(&local_98);
  TPZManVector<double,_3>::~TPZManVector(&local_60);
LAB_011fa240:
  std::__ostream_insert<char,std::char_traits<char>>(out,"\tDimension : ",0xd);
  iVar2 = (**(code **)(*(long *)&(this->super_TPZInterpolationSpace).super_TPZCompEl + 0xb0))(this);
  plVar5 = (long *)std::ostream::operator<<(out,iVar2);
  std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
  std::ostream::put((char)plVar5);
  std::ostream::flush();
  return;
}

Assistant:

void TPZCompElDisc::Print(std::ostream &out) const{
	
	out << "\nDiscontinous element : \n";
	TPZCompEl::Print(out);
	if(Reference()) out << "\tGeometric reference index : " << Reference()->Index() << endl;
	out << "\tMaterial id : " << Reference()->MaterialId() << endl
	<< "\tDegree of interpolation : " <<  this->Degree() << endl
	<< "\tConnect index : " << fConnectIndex << endl
    << "\tUsing qsieta : " << (int)fUseQsiEta << endl
	<< "\tNormalizing constant : " << fConstC << endl
	<< "\tCenter point of the element : ";
    if(fUseQsiEta == false)
    {
        int size = fCenterPoint.NElements(),i;
        for(i=0;i<size-1;i++) out << fCenterPoint[i] << " , ";
        out << "stored xy : " << fCenterPoint[i] << endl;
    }
    else
    {
        TPZGeoEl *Ref = Reference();
        if (Ref) {
            TPZManVector<REAL,3> xcenter(3),loccenter(fCenterPoint);
            Ref->X(loccenter, xcenter);
            out << "stored qsieta " << fCenterPoint << " computed xy " << xcenter << std::endl;
        }
    }
	out << "\tDimension : " << this->Dimension() << endl;
}